

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# molecule.cpp
# Opt level: O0

Bond_p __thiscall indigox::Molecule::GetBondIndex(Molecule *this,uid_t i)

{
  bool bVar1;
  bool bVar2;
  element_type *peVar3;
  uid_t uVar4;
  unsigned_long *__args;
  unordered_map<unsigned_long,_std::weak_ptr<indigox::Bond>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::weak_ptr<indigox::Bond>_>_>_>
  *this_00;
  uid_t in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  long in_RSI;
  element_type *in_RDI;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_long,_std::weak_ptr<indigox::Bond>_>,_false,_false>,_bool>
  pVar6;
  Bond_p BVar7;
  Bond_p b;
  iterator __end2;
  iterator __begin2;
  MolBonds *__range2;
  iterator it;
  Bond_p *bnd;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::weak_ptr<indigox::Bond>_>,_false>
  in_stack_fffffffffffffef0;
  weak_ptr<indigox::Bond> *in_stack_fffffffffffffef8;
  __normal_iterator<std::shared_ptr<indigox::Bond>_*,_std::vector<std::shared_ptr<indigox::Bond>,_std::allocator<std::shared_ptr<indigox::Bond>_>_>_>
  local_78;
  long local_70;
  byte local_51;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::weak_ptr<indigox::Bond>_>,_false>
  local_40 [3];
  _Node_iterator_base<std::pair<const_unsigned_long,_std::weak_ptr<indigox::Bond>_>,_false> local_28
  ;
  undefined1 local_19;
  uid_t local_18;
  
  local_19 = 0;
  local_18 = in_RDX;
  std::shared_ptr<indigox::Bond>::shared_ptr((shared_ptr<indigox::Bond> *)0x10f976);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_std::weak_ptr<indigox::Bond>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::weak_ptr<indigox::Bond>_>_>_>
       ::find((unordered_map<unsigned_long,_std::weak_ptr<indigox::Bond>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::weak_ptr<indigox::Bond>_>_>_>
               *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8),(key_type *)0x10f98f)
  ;
  local_40[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_std::weak_ptr<indigox::Bond>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::weak_ptr<indigox::Bond>_>_>_>
       ::end((unordered_map<unsigned_long,_std::weak_ptr<indigox::Bond>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::weak_ptr<indigox::Bond>_>_>_>
              *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
  bVar1 = std::__detail::operator!=(&local_28,local_40);
  local_51 = 0;
  bVar2 = false;
  if (bVar1) {
    std::__detail::
    _Node_iterator<std::pair<const_unsigned_long,_std::weak_ptr<indigox::Bond>_>,_false,_false>::
    operator->((_Node_iterator<std::pair<const_unsigned_long,_std::weak_ptr<indigox::Bond>_>,_false,_false>
                *)0x10f9f8);
    bVar1 = std::__weak_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>::expired
                      ((__weak_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2> *)0x10fa04);
    bVar2 = false;
    if (!bVar1) {
      std::__detail::
      _Node_iterator<std::pair<const_unsigned_long,_std::weak_ptr<indigox::Bond>_>,_false,_false>::
      operator->((_Node_iterator<std::pair<const_unsigned_long,_std::weak_ptr<indigox::Bond>_>,_false,_false>
                  *)0x10fa1e);
      std::weak_ptr<indigox::Bond>::lock(in_stack_fffffffffffffef8);
      local_51 = 1;
      peVar3 = std::__shared_ptr_access<indigox::Bond,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<indigox::Bond,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x10fa49);
      uVar4 = Bond::GetIndex(peVar3);
      bVar2 = uVar4 == local_18;
    }
  }
  if ((local_51 & 1) != 0) {
    std::shared_ptr<indigox::Bond>::~shared_ptr((shared_ptr<indigox::Bond> *)0x10fa8d);
  }
  if (bVar2) {
    std::__detail::
    _Node_iterator<std::pair<const_unsigned_long,_std::weak_ptr<indigox::Bond>_>,_false,_false>::
    operator->((_Node_iterator<std::pair<const_unsigned_long,_std::weak_ptr<indigox::Bond>_>,_false,_false>
                *)0x10faa7);
    std::weak_ptr<indigox::Bond>::lock(in_stack_fffffffffffffef8);
    std::shared_ptr<indigox::Bond>::operator=
              ((shared_ptr<indigox::Bond> *)in_stack_fffffffffffffef0._M_cur,
               (shared_ptr<indigox::Bond> *)
               CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
    std::shared_ptr<indigox::Bond>::~shared_ptr((shared_ptr<indigox::Bond> *)0x10fada);
    _Var5._M_pi = extraout_RDX;
  }
  else {
    std::
    unordered_map<unsigned_long,_std::weak_ptr<indigox::Bond>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::weak_ptr<indigox::Bond>_>_>_>
    ::clear((unordered_map<unsigned_long,_std::weak_ptr<indigox::Bond>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::weak_ptr<indigox::Bond>_>_>_>
             *)0x10fb3b);
    local_70 = in_RSI + 0x58;
    local_78._M_current =
         (shared_ptr<indigox::Bond> *)
         std::
         vector<std::shared_ptr<indigox::Bond>,_std::allocator<std::shared_ptr<indigox::Bond>_>_>::
         begin((vector<std::shared_ptr<indigox::Bond>,_std::allocator<std::shared_ptr<indigox::Bond>_>_>
                *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
    std::vector<std::shared_ptr<indigox::Bond>,_std::allocator<std::shared_ptr<indigox::Bond>_>_>::
    end((vector<std::shared_ptr<indigox::Bond>,_std::allocator<std::shared_ptr<indigox::Bond>_>_> *)
        CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::shared_ptr<indigox::Bond>_*,_std::vector<std::shared_ptr<indigox::Bond>,_std::allocator<std::shared_ptr<indigox::Bond>_>_>_>
                               *)in_stack_fffffffffffffef0._M_cur,
                              (__normal_iterator<std::shared_ptr<indigox::Bond>_*,_std::vector<std::shared_ptr<indigox::Bond>,_std::allocator<std::shared_ptr<indigox::Bond>_>_>_>
                               *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8)),
          _Var5._M_pi = extraout_RDX_00, bVar2) {
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<indigox::Bond>_*,_std::vector<std::shared_ptr<indigox::Bond>,_std::allocator<std::shared_ptr<indigox::Bond>_>_>_>
      ::operator*(&local_78);
      std::shared_ptr<indigox::Bond>::shared_ptr
                ((shared_ptr<indigox::Bond> *)in_stack_fffffffffffffef0._M_cur,
                 (shared_ptr<indigox::Bond> *)
                 CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
      peVar3 = std::__shared_ptr_access<indigox::Bond,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<indigox::Bond,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x10fbc0);
      uVar4 = Bond::GetIndex(peVar3);
      if (uVar4 == local_18) {
        std::shared_ptr<indigox::Bond>::operator=
                  ((shared_ptr<indigox::Bond> *)in_stack_fffffffffffffef0._M_cur,
                   (shared_ptr<indigox::Bond> *)
                   CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
      }
      __args = (unsigned_long *)(in_RSI + 0xa8);
      peVar3 = std::__shared_ptr_access<indigox::Bond,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<indigox::Bond,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x10fc35);
      this_00 = (unordered_map<unsigned_long,_std::weak_ptr<indigox::Bond>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::weak_ptr<indigox::Bond>_>_>_>
                 *)Bond::GetIndex(peVar3);
      pVar6 = std::
              unordered_map<unsigned_long,std::weak_ptr<indigox::Bond>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::weak_ptr<indigox::Bond>>>>
              ::emplace<unsigned_long,std::shared_ptr<indigox::Bond>&>
                        (this_00,__args,
                         (shared_ptr<indigox::Bond> *)in_stack_fffffffffffffef0._M_cur);
      in_stack_fffffffffffffef0._M_cur =
           (__node_type *)
           pVar6.first.
           super__Node_iterator_base<std::pair<const_unsigned_long,_std::weak_ptr<indigox::Bond>_>,_false>
           ._M_cur;
      in_stack_fffffffffffffeef = pVar6.second;
      std::shared_ptr<indigox::Bond>::~shared_ptr((shared_ptr<indigox::Bond> *)0x10fc95);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<indigox::Bond>_*,_std::vector<std::shared_ptr<indigox::Bond>,_std::allocator<std::shared_ptr<indigox::Bond>_>_>_>
      ::operator++(&local_78);
    }
  }
  BVar7.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  BVar7.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (Bond_p)BVar7.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Bond_p Molecule::GetBondIndex(uid_t i) {
  Bond_p bnd = Bond_p();
  auto it = idx_to_bond_.find(i);
  if (it != idx_to_bond_.end() && !(it->second.expired())
      && it->second.lock()->GetIndex() == i) {
    bnd = it->second.lock();
  } else {
    idx_to_bond_.clear();
    for (Bond_p b : bonds_) {
      if (b->GetIndex() == i) bnd = b;
      idx_to_bond_.emplace(b->GetIndex(), b);
    }
  }
  return bnd;
}